

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu.cpp
# Opt level: O1

bool __thiscall ftxui::MenuBase::OnEvent(MenuBase *this,Event *event)

{
  int iVar1;
  pointer pcVar2;
  ComponentBase *__n;
  size_t __n_00;
  Ref<int> *pRVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  *pvVar7;
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  *pvVar8;
  Ref<int> *pRVar9;
  MenuOption *pMVar10;
  int iVar11;
  MenuOption *pMVar12;
  ulong uVar13;
  undefined1 local_f8 [24];
  _Alloc_hider local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  ScreenInteractive *local_c0;
  Event local_b0;
  Event local_70;
  
  ComponentBase::CaptureMouse((ComponentBase *)&local_b0,(Event *)this);
  if ((_func_int **)local_b0._0_8_ != (_func_int **)0x0) {
    (**(code **)(*(_func_int **)local_b0._0_8_ + 8))(local_b0._0_8_);
    if (event->type_ == Mouse) {
      local_f8._16_8_ = *(undefined8 *)((long)&event->field_1 + 0xc);
      local_f8._0_4_ = event->type_;
      local_f8._4_4_ = (event->field_1).mouse_.button;
      local_f8._8_4_ = (event->field_1).mouse_.motion;
      local_f8._12_4_ = *(undefined4 *)((long)&event->field_1 + 8);
      pcVar2 = (event->input_)._M_dataplus._M_p;
      local_e0._M_p = (pointer)&local_d0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_e0,pcVar2,pcVar2 + (event->input_)._M_string_length);
      local_c0 = event->screen_;
      bVar4 = OnMouseEvent(this,(Event *)local_f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_p != &local_d0) {
        operator_delete(local_e0._M_p,local_d0._M_allocated_capacity + 1);
        return bVar4;
      }
      return bVar4;
    }
    bVar4 = ComponentBase::Focused(&this->super_ComponentBase);
    if (bVar4) {
      iVar1 = *this->selected_;
      bVar5 = Event::operator==(event,(Event *)Event::ArrowUp);
      bVar4 = true;
      if (!bVar5) {
        Event::Character(&local_b0,'k');
        __n = (ComponentBase *)(event->input_)._M_string_length;
        if (__n == (ComponentBase *)local_b0.input_._M_string_length) {
          if (__n != (ComponentBase *)0x0) {
            iVar6 = bcmp((event->input_)._M_dataplus._M_p,local_b0.input_._M_dataplus._M_p,
                         (size_t)__n);
            bVar4 = iVar6 == 0;
          }
        }
        else {
          bVar4 = false;
        }
      }
      if ((!bVar5) && (local_b0.input_._M_dataplus._M_p != (pointer)((long)&local_b0 + 0x28U))) {
        operator_delete(local_b0.input_._M_dataplus._M_p,
                        local_b0.input_.field_2._M_allocated_capacity + 1);
      }
      if (bVar4) {
        *this->selected_ = *this->selected_ + -1;
      }
      bVar5 = Event::operator==(event,(Event *)Event::ArrowDown);
      bVar4 = true;
      if (!bVar5) {
        Event::Character(&local_70,'j');
        __n_00 = (event->input_)._M_string_length;
        if (__n_00 == local_70.input_._M_string_length) {
          if (__n_00 != 0) {
            iVar6 = bcmp((event->input_)._M_dataplus._M_p,local_70.input_._M_dataplus._M_p,__n_00);
            bVar4 = iVar6 == 0;
          }
        }
        else {
          bVar4 = false;
        }
      }
      if ((!bVar5) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70.input_._M_dataplus._M_p != &local_70.input_.field_2)) {
        operator_delete(local_70.input_._M_dataplus._M_p,
                        local_70.input_.field_2._M_allocated_capacity + 1);
      }
      if (bVar4) {
        *this->selected_ = *this->selected_ + 1;
      }
      bVar4 = Event::operator==(event,(Event *)Event::Tab);
      if (bVar4) {
        pvVar8 = (vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                  *)(this->entries_).ref_;
        pvVar7 = pvVar8;
        if (pvVar8 == (vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                       *)0x0) {
          pvVar7 = (this->entries_).ref_wide_;
        }
        if (*(pointer *)(pvVar7 + 8) != *(pointer *)pvVar7) {
          if (pvVar8 == (vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                         *)0x0) {
            pvVar8 = (this->entries_).ref_wide_;
          }
          *this->selected_ =
               (int)(((long)*this->selected_ + 1U) %
                    (ulong)((long)*(pointer *)(pvVar8 + 8) - *(long *)pvVar8 >> 5));
        }
      }
      bVar4 = Event::operator==(event,(Event *)Event::TabReverse);
      if (bVar4) {
        pvVar8 = (vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                  *)(this->entries_).ref_;
        pvVar7 = pvVar8;
        if (pvVar8 == (vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                       *)0x0) {
          pvVar7 = (this->entries_).ref_wide_;
        }
        if (*(pointer *)(pvVar7 + 8) != *(pointer *)pvVar7) {
          if (pvVar8 == (vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                         *)0x0) {
            pvVar8 = (this->entries_).ref_wide_;
          }
          uVar13 = (long)*(pointer *)(pvVar8 + 8) - *(long *)pvVar8 >> 5;
          *this->selected_ = (int)((((long)*this->selected_ + uVar13) - 1) % uVar13);
        }
      }
      pvVar8 = (vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                *)(this->entries_).ref_;
      if (pvVar8 == (vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                     *)0x0) {
        pvVar8 = (this->entries_).ref_wide_;
      }
      iVar11 = (int)((ulong)((long)*(pointer *)(pvVar8 + 8) - *(long *)pvVar8) >> 5) + -1;
      iVar6 = *this->selected_;
      if (iVar6 < iVar11) {
        iVar11 = iVar6;
      }
      iVar6 = 0;
      if (0 < iVar11) {
        iVar6 = iVar11;
      }
      *this->selected_ = iVar6;
      if (iVar6 == iVar1) {
        bVar4 = Event::operator==(event,(Event *)Event::Return);
        if (!bVar4) {
          return false;
        }
        pMVar10 = (this->option_).address_;
        pMVar12 = &(this->option_).owned_;
        if (pMVar10 != (MenuOption *)0x0) {
          pMVar12 = pMVar10;
        }
        if ((pMVar12->on_enter).super__Function_base._M_manager == (_Manager_type)0x0) {
LAB_001409f2:
          std::__throw_bad_function_call();
        }
        (*(pMVar12->on_enter)._M_invoker)((_Any_data *)&pMVar12->on_enter);
      }
      else {
        pMVar10 = (this->option_).address_;
        if (pMVar10 == (MenuOption *)0x0) {
          pMVar10 = &(this->option_).owned_;
        }
        pRVar3 = (Ref<int> *)(pMVar10->focused_entry).address_;
        pRVar9 = &pMVar10->focused_entry;
        if (pRVar3 != (Ref<int> *)0x0) {
          pRVar9 = pRVar3;
        }
        pRVar9->owned_ = iVar6;
        pMVar10 = (this->option_).address_;
        if (pMVar10 == (MenuOption *)0x0) {
          pMVar10 = &(this->option_).owned_;
        }
        if ((pMVar10->on_change).super__Function_base._M_manager == (_Manager_type)0x0)
        goto LAB_001409f2;
        (*(pMVar10->on_change)._M_invoker)((_Any_data *)&pMVar10->on_change);
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool OnEvent(Event event) {
    if (!CaptureMouse(event))
      return false;
    if (event.is_mouse())
      return OnMouseEvent(event);

    if (!Focused())
      return false;

    int old_selected = *selected_;
    if (event == Event::ArrowUp || event == Event::Character('k'))
      (*selected_)--;
    if (event == Event::ArrowDown || event == Event::Character('j'))
      (*selected_)++;
    if (event == Event::Tab && entries_.size())
      *selected_ = (*selected_ + 1) % entries_.size();
    if (event == Event::TabReverse && entries_.size())
      *selected_ = (*selected_ + entries_.size() - 1) % entries_.size();

    *selected_ = std::max(0, std::min(int(entries_.size()) - 1, *selected_));

    if (*selected_ != old_selected) {
      focused_entry() = *selected_;
      option_->on_change();
      return true;
    }

    if (event == Event::Return) {
      option_->on_enter();
      return true;
    }

    return false;
  }